

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_mp3_init_memory
                    (ma_dr_mp3 *pMP3,void *pData,size_t dataSize,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  
  if (pMP3 != (ma_dr_mp3 *)0x0) {
    memset(pMP3,0,0x3ec0);
    if (dataSize != 0 && pData != (void *)0x0) {
      (pMP3->memory).pData = (ma_uint8 *)pData;
      (pMP3->memory).dataSize = dataSize;
      (pMP3->memory).currentReadPos = 0;
      mVar1 = ma_dr_mp3_init_internal
                        (pMP3,ma_dr_mp3__on_read_memory,ma_dr_mp3__on_seek_memory,pMP3,
                         pAllocationCallbacks);
      return mVar1;
    }
  }
  return 0;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_init_memory(ma_dr_mp3* pMP3, const void* pData, size_t dataSize, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pMP3 == NULL) {
        return MA_FALSE;
    }
    MA_DR_MP3_ZERO_OBJECT(pMP3);
    if (pData == NULL || dataSize == 0) {
        return MA_FALSE;
    }
    pMP3->memory.pData = (const ma_uint8*)pData;
    pMP3->memory.dataSize = dataSize;
    pMP3->memory.currentReadPos = 0;
    return ma_dr_mp3_init_internal(pMP3, ma_dr_mp3__on_read_memory, ma_dr_mp3__on_seek_memory, pMP3, pAllocationCallbacks);
}